

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O1

void __thiscall OpenMD::ForceMatrixDecomposition::collectData(ForceMatrixDecomposition *this)

{
  return;
}

Assistant:

void ForceMatrixDecomposition::collectData() {
#ifdef IS_MPI
    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();

    int n = snap_->atomData.force.size();
    vector<Vector3d> frc_tmp(n, V3Zero);

    AtomPlanVectorRow->scatter(atomRowData.force, frc_tmp);
    for (int i = 0; i < n; i++) {
      snap_->atomData.force[i] += frc_tmp[i];
      frc_tmp[i] = 0.0;
    }

    AtomPlanVectorColumn->scatter(atomColData.force, frc_tmp);
    for (int i = 0; i < n; i++) {
      snap_->atomData.force[i] += frc_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      int nt = snap_->atomData.torque.size();
      vector<Vector3d> trq_tmp(nt, V3Zero);

      AtomPlanVectorRow->scatter(atomRowData.torque, trq_tmp);
      for (int i = 0; i < nt; i++) {
        snap_->atomData.torque[i] += trq_tmp[i];
        trq_tmp[i] = 0.0;
      }

      AtomPlanVectorColumn->scatter(atomColData.torque, trq_tmp);
      for (int i = 0; i < nt; i++)
        snap_->atomData.torque[i] += trq_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      int ns = snap_->atomData.skippedCharge.size();
      vector<RealType> skch_tmp(ns, 0.0);

      AtomPlanRealRow->scatter(atomRowData.skippedCharge, skch_tmp);
      for (int i = 0; i < ns; i++) {
        snap_->atomData.skippedCharge[i] += skch_tmp[i];
        skch_tmp[i] = 0.0;
      }

      AtomPlanRealColumn->scatter(atomColData.skippedCharge, skch_tmp);
      for (int i = 0; i < ns; i++)
        snap_->atomData.skippedCharge[i] += skch_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      int nq = snap_->atomData.flucQFrc.size();
      vector<RealType> fqfrc_tmp(nq, 0.0);

      AtomPlanRealRow->scatter(atomRowData.flucQFrc, fqfrc_tmp);
      for (int i = 0; i < nq; i++) {
        snap_->atomData.flucQFrc[i] += fqfrc_tmp[i];
        fqfrc_tmp[i] = 0.0;
      }

      AtomPlanRealColumn->scatter(atomColData.flucQFrc, fqfrc_tmp);
      for (int i = 0; i < nq; i++)
        snap_->atomData.flucQFrc[i] += fqfrc_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      int nef = snap_->atomData.electricField.size();
      vector<Vector3d> efield_tmp(nef, V3Zero);

      AtomPlanVectorRow->scatter(atomRowData.electricField, efield_tmp);
      for (int i = 0; i < nef; i++) {
        snap_->atomData.electricField[i] += efield_tmp[i];
        efield_tmp[i] = 0.0;
      }

      AtomPlanVectorColumn->scatter(atomColData.electricField, efield_tmp);
      for (int i = 0; i < nef; i++)
        snap_->atomData.electricField[i] += efield_tmp[i];
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      int nsp = snap_->atomData.sitePotential.size();
      vector<RealType> sp_tmp(nsp, 0.0);

      AtomPlanRealRow->scatter(atomRowData.sitePotential, sp_tmp);
      for (int i = 0; i < nsp; i++) {
        snap_->atomData.sitePotential[i] += sp_tmp[i];
        sp_tmp[i] = 0.0;
      }

      AtomPlanRealColumn->scatter(atomColData.sitePotential, sp_tmp);
      for (int i = 0; i < nsp; i++)
        snap_->atomData.sitePotential[i] += sp_tmp[i];
    }

    nLocal_ = snap_->getNumberOfAtoms();

    vector<potVec> pot_temp(nLocal_,
                            Vector<RealType, N_INTERACTION_FAMILIES>(0.0));
    vector<potVec> expot_temp(nLocal_,
                              Vector<RealType, N_INTERACTION_FAMILIES>(0.0));
    vector<potVec> selepot_temp(nLocal_,
                                Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    // scatter/gather pot_row into the members of my column

    AtomPlanPotRow->scatter(pot_row, pot_temp);
    AtomPlanPotRow->scatter(expot_row, expot_temp);
    AtomPlanPotRow->scatter(selepot_row, selepot_temp);

    for (std::size_t ii = 0; ii < pot_temp.size(); ii++)
      pairwisePot += pot_temp[ii];

    for (std::size_t ii = 0; ii < expot_temp.size(); ii++)
      excludedPot += expot_temp[ii];

    for (std::size_t ii = 0; ii < selepot_temp.size(); ii++)
      selectedPot += selepot_temp[ii];

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      // This is the pairwise contribution to the particle pot.  The
      // embedding contribution is added in each of the low level
      // non-bonded routines.  In single processor, this is done in
      // unpackInteractionData, not in collectData.
      for (int ii = 0; ii < N_INTERACTION_FAMILIES; ii++) {
        for (int i = 0; i < nLocal_; i++) {
          // factor of two is because the total potential terms are divided
          // by 2 in parallel due to row/ column scatter
          snap_->atomData.particlePot[i] += 2.0 * pot_temp[i](ii);
        }
      }
    }

    fill(pot_temp.begin(), pot_temp.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));
    fill(expot_temp.begin(), expot_temp.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));
    fill(selepot_temp.begin(), selepot_temp.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    AtomPlanPotColumn->scatter(pot_col, pot_temp);
    AtomPlanPotColumn->scatter(expot_col, expot_temp);
    AtomPlanPotColumn->scatter(selepot_col, selepot_temp);

    for (std::size_t ii = 0; ii < pot_temp.size(); ii++)
      pairwisePot += pot_temp[ii];

    for (std::size_t ii = 0; ii < expot_temp.size(); ii++)
      excludedPot += expot_temp[ii];

    for (std::size_t ii = 0; ii < selepot_temp.size(); ii++)
      selectedPot += selepot_temp[ii];

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      // This is the pairwise contribution to the particle pot.  The
      // embedding contribution is added in each of the low level
      // non-bonded routines.  In single processor, this is done in
      // unpackInteractionData, not in collectData.
      for (int ii = 0; ii < N_INTERACTION_FAMILIES; ii++) {
        for (int i = 0; i < nLocal_; i++) {
          // factor of two is because the total potential terms are divided
          // by 2 in parallel due to row/ column scatter
          snap_->atomData.particlePot[i] += 2.0 * pot_temp[i](ii);
        }
      }
    }

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      int npp = snap_->atomData.particlePot.size();
      vector<RealType> ppot_temp(npp, 0.0);

      // This is the direct or embedding contribution to the particle
      // pot.

      AtomPlanRealRow->scatter(atomRowData.particlePot, ppot_temp);
      for (int i = 0; i < npp; i++) {
        snap_->atomData.particlePot[i] += ppot_temp[i];
      }

      fill(ppot_temp.begin(), ppot_temp.end(), 0.0);

      AtomPlanRealColumn->scatter(atomColData.particlePot, ppot_temp);
      for (int i = 0; i < npp; i++) {
        snap_->atomData.particlePot[i] += ppot_temp[i];
      }
    }

    MPI_Allreduce(MPI_IN_PLACE, &pairwisePot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    MPI_Allreduce(MPI_IN_PLACE, &excludedPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    MPI_Allreduce(MPI_IN_PLACE, &selectedPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    // Here be dragons.
    MPI_Comm col = colComm.getComm();

    MPI_Allreduce(MPI_IN_PLACE, &snap_->frameData.conductiveHeatFlux[0], 3,
                  MPI_REALTYPE, MPI_SUM, col);
#endif
  }